

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
copy_str<char32_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
          (char *begin,char *end,back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  for (; begin != end; begin = begin + 1) {
    uStack_28 = CONCAT44((int)*begin,(undefined4)uStack_28);
    buffer<char32_t>::push_back(out.container,(char32_t *)((long)&uStack_28 + 4));
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)out.container;
}

Assistant:

FMT_CONSTEXPR auto copy_str(InputIt begin, InputIt end, OutputIt out)
    -> OutputIt {
  while (begin != end) *out++ = static_cast<Char>(*begin++);
  return out;
}